

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUTF16CollationIterator::previousSegment
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UChar *pUVar1;
  UBool UVar2;
  byte bVar3;
  bool bVar4;
  ushort local_3a;
  uint8_t trailCC;
  uint16_t fcd16;
  UChar *q;
  UChar *pUStack_28;
  uint8_t nextCC;
  UChar *p;
  UErrorCode *errorCode_local;
  FCDUTF16CollationIterator *this_local;
  
  p = (UChar *)errorCode;
  errorCode_local = (UErrorCode *)this;
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 != '\0') {
    return '\0';
  }
  pUStack_28 = (this->super_UTF16CollationIterator).pos;
  q._7_1_ = 0;
  do {
    pUVar1 = pUStack_28;
    local_3a = Normalizer2Impl::previousFCD16(this->nfcImpl,this->rawStart,&stack0xffffffffffffffd8)
    ;
    bVar3 = (byte)local_3a;
    if ((bVar3 == 0) && (pUVar1 != (this->super_UTF16CollationIterator).pos)) {
      this->segmentStart = pUVar1;
      (this->super_UTF16CollationIterator).start = pUVar1;
      goto LAB_00277563;
    }
    if ((bVar3 != 0) &&
       (((q._7_1_ != 0 && (q._7_1_ < bVar3)) ||
        (UVar2 = CollationFCD::isFCD16OfTibetanCompositeVowel(local_3a), UVar2 != '\0'))))
    goto LAB_0027748b;
    q._7_1_ = (byte)(local_3a >> 8);
  } while ((pUStack_28 != this->rawStart) && (q._7_1_ != 0));
  this->segmentStart = pUStack_28;
  (this->super_UTF16CollationIterator).start = pUStack_28;
LAB_00277563:
  this->checkDir = '\0';
  return '\x01';
LAB_0027748b:
  do {
    pUVar1 = pUStack_28;
    bVar4 = false;
    if ((0xff < local_3a) && (bVar4 = false, pUStack_28 != this->rawStart)) {
      local_3a = Normalizer2Impl::previousFCD16
                           (this->nfcImpl,this->rawStart,&stack0xffffffffffffffd8);
      bVar4 = local_3a != 0;
    }
  } while (bVar4);
  UVar2 = normalize(this,pUVar1,(this->super_UTF16CollationIterator).pos,(UErrorCode *)p);
  if (UVar2 == '\0') {
    return '\0';
  }
  (this->super_UTF16CollationIterator).pos = (this->super_UTF16CollationIterator).limit;
  goto LAB_00277563;
}

Assistant:

UBool
FCDUTF16CollationIterator::previousSegment(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(checkDir < 0 && pos != start);
    // The input text [pos..segmentLimit[ passes the FCD check.
    const UChar *p = pos;
    uint8_t nextCC = 0;
    for(;;) {
        // Fetch the previous character's fcd16 value.
        const UChar *q = p;
        uint16_t fcd16 = nfcImpl.previousFCD16(rawStart, p);
        uint8_t trailCC = (uint8_t)fcd16;
        if(trailCC == 0 && q != pos) {
            // FCD boundary after the [p, q[ character.
            start = segmentStart = q;
            break;
        }
        if(trailCC != 0 && ((nextCC != 0 && trailCC > nextCC) ||
                            CollationFCD::isFCD16OfTibetanCompositeVowel(fcd16))) {
            // Fails FCD check. Find the previous FCD boundary and normalize.
            do {
                q = p;
            } while(fcd16 > 0xff && p != rawStart &&
                    (fcd16 = nfcImpl.previousFCD16(rawStart, p)) != 0);
            if(!normalize(q, pos, errorCode)) { return FALSE; }
            pos = limit;
            break;
        }
        nextCC = (uint8_t)(fcd16 >> 8);
        if(p == rawStart || nextCC == 0) {
            // FCD boundary before the following character.
            start = segmentStart = p;
            break;
        }
    }
    U_ASSERT(pos != start);
    checkDir = 0;
    return TRUE;
}